

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O0

int lws_chunked_html_process(lws_process_html_args *args,lws_process_html_state *s)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  size_t sVar4;
  int local_60;
  int local_5c;
  int hit;
  int hits;
  int n;
  int old_len;
  char *pc;
  char buffer [32];
  char *sp;
  lws_process_html_state *s_local;
  lws_process_html_args *args_local;
  
  buffer._24_8_ = args->p;
  hits = args->len;
  args->len = 0;
  s->start = (char *)buffer._24_8_;
  do {
    while( true ) {
      while( true ) {
        if (args->p + hits <= (ulong)buffer._24_8_) {
          if (args->chunked != 0) {
            if ((args->final != 0) && (args->max_len <= args->len + 7)) {
              return -1;
            }
            iVar3 = sprintf((char *)&pc,"%X\r\n",(ulong)(uint)args->len);
            args->p = args->p + -(long)iVar3;
            memcpy(args->p,&pc,(long)iVar3);
            args->len = iVar3 + args->len;
            if (args->final == 0) {
              pcVar2 = args->p;
              iVar3 = args->len;
              pcVar2[iVar3] = '\r';
              (pcVar2 + iVar3)[1] = '\n';
              args->len = args->len + 2;
            }
            else {
              builtin_strncpy(args->p + args->len,"\r\n0\r\n\r\n",7);
              args->len = args->len + 7;
            }
          }
          return 0;
        }
        if (args->max_len <= args->len + 7) {
          _lws_log(1,"Used up interpret padding\n");
          return -1;
        }
        if (((s->pos == 0) && (*(char *)buffer._24_8_ == '$')) || (s->pos != 0)) break;
        args->len = args->len + 1;
        buffer._24_8_ = buffer._24_8_ + 1;
      }
      local_5c = 0;
      local_60 = 0;
      if (s->pos == 0) {
        s->start = (char *)buffer._24_8_;
      }
      cVar1 = *(char *)buffer._24_8_;
      iVar3 = s->pos;
      s->pos = iVar3 + 1;
      s->swallow[iVar3] = cVar1;
      if (s->pos != 0xf) break;
LAB_00156ae0:
      s->swallow[s->pos] = '\0';
      memcpy(s->start,s->swallow,(long)s->pos);
      args->len = args->len + 1;
      s->pos = 0;
      buffer._24_8_ = s->start + 1;
    }
    for (hit = 0; hit < s->count_vars; hit = hit + 1) {
      iVar3 = strncmp(s->swallow,s->vars[hit],(long)s->pos);
      if (iVar3 == 0) {
        local_5c = local_5c + 1;
        local_60 = hit;
      }
    }
    if (local_5c == 0) goto LAB_00156ae0;
    if ((local_5c == 1) && (iVar3 = s->pos, sVar4 = strlen(s->vars[local_60]), iVar3 == (int)sVar4))
    {
      _n = (*s->replace)(s->data,local_60);
      if (_n == (char *)0x0) {
        _n = "NULL";
      }
      sVar4 = strlen(_n);
      iVar3 = (int)sVar4;
      s->swallow[s->pos] = '\0';
      if (iVar3 != s->pos) {
        memmove(s->start + iVar3,s->start + s->pos,
                ((long)hits - (buffer._24_8_ - (long)args->p)) - 1);
        hits = (iVar3 - s->pos) + 1 + hits;
      }
      memcpy(s->start,_n,(long)iVar3);
      args->len = args->len + 1;
      buffer._24_8_ = s->start + 1;
      s->pos = 0;
    }
    buffer._24_8_ = buffer._24_8_ + 1;
  } while( true );
}

Assistant:

int
lws_chunked_html_process(struct lws_process_html_args *args,
			 struct lws_process_html_state *s)
{
	char *sp, buffer[32];
	const char *pc;
	int old_len, n;

	/* do replacements */
	sp = args->p;
	old_len = args->len;
	args->len = 0;
	s->start = sp;
	while (sp < args->p + old_len) {

		if (args->len + 7 >= args->max_len) {
			lwsl_err("Used up interpret padding\n");
			return -1;
		}

		if ((!s->pos && *sp == '$') || s->pos) {
			int hits = 0, hit = 0;

			if (!s->pos)
				s->start = sp;
			s->swallow[s->pos++] = *sp;
			if (s->pos == sizeof(s->swallow) - 1)
				goto skip;
			for (n = 0; n < s->count_vars; n++)
				if (!strncmp(s->swallow, s->vars[n], s->pos)) {
					hits++;
					hit = n;
				}
			if (!hits) {
skip:
				s->swallow[s->pos] = '\0';
				memcpy(s->start, s->swallow, s->pos);
				args->len++;
				s->pos = 0;
				sp = s->start + 1;
				continue;
			}
			if (hits == 1 && s->pos == (int)strlen(s->vars[hit])) {
				pc = s->replace(s->data, hit);
				if (!pc)
					pc = "NULL";
				n = (int)strlen(pc);
				s->swallow[s->pos] = '\0';
				if (n != s->pos) {
					memmove(s->start + n, s->start + s->pos,
						old_len - (sp - args->p) - 1);
					old_len += (n - s->pos) + 1;
				}
				memcpy(s->start, pc, n);
				args->len++;
				sp = s->start + 1;

				s->pos = 0;
			}
			sp++;
			continue;
		}

		args->len++;
		sp++;
	}

	if (args->chunked) {
		/* no space left for final chunk trailer */
		if (args->final && args->len + 7 >= args->max_len)
			return -1;

		n = sprintf(buffer, "%X\x0d\x0a", args->len);

		args->p -= n;
		memcpy(args->p, buffer, n);
		args->len += n;

		if (args->final) {
			sp = args->p + args->len;
			*sp++ = '\x0d';
			*sp++ = '\x0a';
			*sp++ = '0';
			*sp++ = '\x0d';
			*sp++ = '\x0a';
			*sp++ = '\x0d';
			*sp++ = '\x0a';
			args->len += 7;
		} else {
			sp = args->p + args->len;
			*sp++ = '\x0d';
			*sp++ = '\x0a';
			args->len += 2;
		}
	}

	return 0;
}